

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void init_hduname(void)

{
  HduName *pHVar1;
  int local_c;
  int i;
  
  hduname = (HduName **)malloc((long)totalhdu << 3);
  for (local_c = 0; local_c < totalhdu; local_c = local_c + 1) {
    pHVar1 = (HduName *)calloc(1,0x5c);
    hduname[local_c] = pHVar1;
    hduname[local_c]->hdutype = -1;
    hduname[local_c]->errnum = 0;
    hduname[local_c]->wrnno = 0;
    strcpy(hduname[local_c]->extname,"");
    hduname[local_c]->extver = 0;
  }
  return;
}

Assistant:

void init_hduname() 
{
    int i;
    /* allocate memories for the hdu structure array  */
    hduname = (HduName **)malloc(totalhdu*sizeof(HduName *));
    for (i=0; i < totalhdu; i++) { 
	hduname[i] = (HduName *)calloc(1, sizeof(HduName));
	hduname[i]->hdutype = -1;
        hduname[i]->errnum = 0; 
        hduname[i]->wrnno = 0;
        strcpy(hduname[i]->extname,"");
        hduname[i]->extver = 0;
    }
    return;
}